

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio.c
# Opt level: O0

void test_write_format_cpio(void)

{
  int64_t size_8g;
  int64_t size_4g;
  int in_stack_00000024;
  int64_t in_stack_00000028;
  _func_int_archive_ptr *in_stack_00000030;
  _func_int_archive_ptr *in_stack_00000070;
  
  test_format(in_stack_00000070);
  test_format(in_stack_00000070);
  test_big_entries(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  test_big_entries(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  test_big_entries(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  test_big_entries(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_cpio)
{
	int64_t size_4g = ((int64_t)1) << 32;
	int64_t size_8g = ((int64_t)1) << 33;

	test_format(archive_write_set_format_cpio);
	test_format(archive_write_set_format_cpio_newc);

	test_big_entries(archive_write_set_format_cpio,
	    size_8g - 1, ARCHIVE_OK);
	test_big_entries(archive_write_set_format_cpio,
	    size_8g, ARCHIVE_FAILED);
	test_big_entries(archive_write_set_format_cpio_newc,
	    size_4g - 1, ARCHIVE_OK);
	test_big_entries(archive_write_set_format_cpio_newc,
	    size_4g, ARCHIVE_FAILED);
}